

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * __thiscall
FastPForLib::__fastpackwithoutmask22_24(FastPForLib *this,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  uVar1 = *(uint *)(this + 4);
  vpmovsxbd_avx(ZEXT416(0x3024180c));
  iVar2 = *(int *)(this + 0x4c);
  uVar3 = *(uint *)(this + 0x54);
  *in = uVar1 << 0x16 | *(uint *)this;
  uVar4 = *(uint *)(this + 8);
  in[1] = uVar4 << 0xc | uVar1 >> 10;
  uVar1 = *(uint *)(this + 0x3c);
  auVar9 = vpgatherdd_avx512vl(*(undefined4 *)(this + uVar1));
  auVar6 = vpsllvd_avx2(auVar9,_DAT_0019d660);
  vpmovsxbd_avx2(ZEXT816(0x38342c28201c1410));
  auVar10 = vpgatherdd_avx512vl(*(undefined4 *)(this + (long)out));
  auVar9 = vpmovsxbd_avx(ZEXT416(0x5030108));
  auVar11 = vpermi2d_avx512vl(ZEXT1632(auVar9),auVar10,ZEXT432(uVar4));
  auVar9 = vpsrlvd_avx2(auVar11._0_16_,_DAT_001aa5a0);
  uVar4 = *(uint *)(this + 0x44);
  auVar9 = vpor_avx(auVar6,auVar9);
  auVar11 = vpshufd_avx2(auVar10,0xa0);
  auVar8 = vpsrlvd_avx2(auVar11,_DAT_001ab4c0);
  auVar7 = vpsllvd_avx2(auVar10,_DAT_001ab4e0);
  auVar11 = vpmovzxdq_avx2(auVar9);
  auVar11 = vpblendd_avx2(auVar11,auVar8,0xaa);
  auVar11 = vpor_avx2(auVar7,auVar11);
  *(undefined1 (*) [32])(in + 2) = auVar11;
  in[10] = uVar1 << 10 | auVar10._28_4_ >> 0xc;
  in[0xb] = uVar4 << 0x16 | *(uint *)(this + 0x40);
  uVar1 = *(uint *)(this + 0x48);
  in[0xc] = uVar1 << 0xc | uVar4 >> 10;
  uVar4 = *(uint *)(this + 0x50);
  iVar5 = *(int *)(this + 0x58);
  in[0xd] = uVar4 << 0x18 | iVar2 << 2 | uVar1 >> 0x14;
  uVar1 = *(uint *)(this + 0x5c);
  in[0xe] = uVar3 << 0xe | uVar4 >> 8;
  in[0xf] = uVar1 << 0x1a | iVar5 << 4 | uVar3 >> 0x12;
  in[0x10] = uVar1 >> 6;
  return in + 0x11;
}

Assistant:

uint32_t *__fastpackwithoutmask22_24(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (22 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (22 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (22 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (22 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (22 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  ++in;
  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;

  return out + 1;
}